

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseCharData(xmlParserCtxtPtr ctxt,int cdata)

{
  xmlChar *pxVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  xmlChar *tmp_1;
  xmlChar *tmp;
  int ccol;
  int col;
  int line;
  int nbchar;
  xmlChar *in;
  int cdata_local;
  xmlParserCtxtPtr ctxt_local;
  
  ccol = ctxt->input->line;
  tmp._4_4_ = ctxt->input->col;
  if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
    xmlSHRINK(ctxt);
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if ((ctxt->mlType == XML_TYPE_XML) && (cdata == 0)) {
    _line = ctxt->input->cur;
    do {
      while( true ) {
        while (*_line == 0x20) {
          _line = _line + 1;
          ctxt->input->col = ctxt->input->col + 1;
        }
        if (*_line != 10) break;
        do {
          ctxt->input->line = ctxt->input->line + 1;
          ctxt->input->col = 1;
          _line = _line + 1;
        } while (*_line == 10);
      }
      if (*_line == 0x3c) {
        iVar2 = (int)_line - (int)ctxt->input->cur;
        if (iVar2 < 1) {
          return;
        }
        pxVar1 = ctxt->input->cur;
        ctxt->input->cur = _line;
        if ((ctxt->sax == (_xmlSAXHandler *)0x0) ||
           (ctxt->sax->ignorableWhitespace == ctxt->sax->characters)) {
          if (ctxt->sax == (_xmlSAXHandler *)0x0) {
            return;
          }
          if (ctxt->sax->characters == (charactersSAXFunc)0x0) {
            return;
          }
          (*ctxt->sax->characters)(ctxt->userData,pxVar1,iVar2);
          return;
        }
        iVar3 = areBlanks(ctxt,pxVar1,iVar2,1);
        if (iVar3 != 0) {
          if (ctxt->sax->ignorableWhitespace == (ignorableWhitespaceSAXFunc)0x0) {
            return;
          }
          (*ctxt->sax->ignorableWhitespace)(ctxt->userData,pxVar1,iVar2);
          return;
        }
        if (ctxt->sax->characters != (charactersSAXFunc)0x0) {
          (*ctxt->sax->characters)(ctxt->userData,pxVar1,iVar2);
        }
        if (*ctxt->space != -1) {
          return;
        }
        *ctxt->space = -2;
        return;
      }
      while( true ) {
        while( true ) {
          tmp._0_4_ = ctxt->input->col;
          while (""[*_line] != '\0') {
            _line = _line + 1;
            tmp._0_4_ = (int)tmp + 1;
          }
          ctxt->input->col = (int)tmp;
          if (*_line != 10) break;
          do {
            ctxt->input->line = ctxt->input->line + 1;
            ctxt->input->col = 1;
            _line = _line + 1;
          } while (*_line == 10);
        }
        if (*_line != 0x5d) break;
        if ((_line[1] == 0x5d) && (_line[2] == 0x3e)) {
          xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
          ctxt->input->cur = _line + 1;
          return;
        }
        _line = _line + 1;
        ctxt->input->col = ctxt->input->col + 1;
      }
      iVar2 = (int)_line - (int)ctxt->input->cur;
      if (0 < iVar2) {
        if (((ctxt->sax == (_xmlSAXHandler *)0x0) ||
            (ctxt->sax->ignorableWhitespace == ctxt->sax->characters)) ||
           ((*ctxt->input->cur != ' ' &&
            (((*ctxt->input->cur < 9 || (10 < *ctxt->input->cur)) && (*ctxt->input->cur != '\r')))))
           ) {
          if (ctxt->sax != (_xmlSAXHandler *)0x0) {
            if (ctxt->sax->characters != (charactersSAXFunc)0x0) {
              (*ctxt->sax->characters)(ctxt->userData,ctxt->input->cur,iVar2);
            }
            ccol = ctxt->input->line;
            tmp._4_4_ = ctxt->input->col;
          }
        }
        else {
          pxVar1 = ctxt->input->cur;
          ctxt->input->cur = _line;
          iVar3 = areBlanks(ctxt,pxVar1,iVar2,0);
          if (iVar3 == 0) {
            if (ctxt->sax->characters != (charactersSAXFunc)0x0) {
              (*ctxt->sax->characters)(ctxt->userData,pxVar1,iVar2);
            }
            if (*ctxt->space == -1) {
              *ctxt->space = -2;
            }
          }
          else if (ctxt->sax->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) {
            (*ctxt->sax->ignorableWhitespace)(ctxt->userData,pxVar1,iVar2);
          }
          ccol = ctxt->input->line;
          tmp._4_4_ = ctxt->input->col;
        }
        if (ctxt->instate != XML_PARSER_CONTENT) {
          return;
        }
      }
      ctxt->input->cur = _line;
      if ((*_line == 0xd) && (_line[1] == 10)) {
        ctxt->input->cur = _line + 1;
        _line = _line + 2;
        ctxt->input->line = ctxt->input->line + 1;
        ctxt->input->col = 1;
      }
      else {
        if (*_line == 0x3c) {
          return;
        }
        if (*_line == 0x26) {
          return;
        }
        if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base))
           && ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
          xmlSHRINK(ctxt);
        }
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return;
        }
        _line = ctxt->input->cur;
      }
      if (((*_line < 0x20) || (bVar4 = true, 0x7f < *_line)) && (bVar4 = true, *_line != 9)) {
        bVar4 = *_line == 10;
      }
    } while (bVar4);
  }
  ctxt->input->line = ccol;
  ctxt->input->col = tmp._4_4_;
  xmlParseCharDataComplex(ctxt,cdata);
  return;
}

Assistant:

void
xmlParseCharData(xmlParserCtxtPtr ctxt, int cdata) {
    const xmlChar *in;
    int nbchar = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;
    int ccol;
    DEBUG_CODE(
    const xmlChar *cur0 = ctxt->input->cur;
    );

    DEBUG_ENTER(("xmlParseCharData(%s, %d);\n", dbgCtxt(ctxt), cdata));

    SHRINK;
    GROW;
    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    if (ISXML && !cdata) {
	in = ctxt->input->cur;
	do {
get_more_space:
	    while (*in == 0x20) { in++; ctxt->input->col++; }
	    if (*in == 0xA) {
		do {
		    ctxt->input->line++; ctxt->input->col = 1;
		    in++;
		} while (*in == 0xA);
		goto get_more_space;
	    }
	    if (*in == '<') {
		nbchar = in - ctxt->input->cur;
		if (nbchar > 0) {
		    const xmlChar *tmp = ctxt->input->cur;
		    ctxt->input->cur = in;

		    if ((ctxt->sax != NULL) &&
		        (ctxt->sax->ignorableWhitespace !=
		         ctxt->sax->characters)) {
			if (areBlanks(ctxt, tmp, nbchar, 1)) {
			    if (ctxt->sax->ignorableWhitespace != NULL)
				ctxt->sax->ignorableWhitespace(ctxt->userData,
						       tmp, nbchar);
			} else {
			    if (ctxt->sax->characters != NULL)
				ctxt->sax->characters(ctxt->userData,
						      tmp, nbchar);
			    if (*ctxt->space == -1)
			        *ctxt->space = -2;
			}
		    } else if ((ctxt->sax != NULL) &&
		               (ctxt->sax->characters != NULL)) {
			ctxt->sax->characters(ctxt->userData,
					      tmp, nbchar);
		    }
		}
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }

get_more:
            ccol = ctxt->input->col;
	    while (test_char_data[*in]) {
		in++;
		ccol++;
	    }
	    ctxt->input->col = ccol;
	    if (*in == 0xA) {
		do {
		    ctxt->input->line++; ctxt->input->col = 1;
		    in++;
		} while (*in == 0xA);
		goto get_more;
	    }
	    if (*in == ']') {
		if ((in[1] == ']') && (in[2] == '>')) {
		    xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
		    ctxt->input->cur = in + 1;
		    RETURN();
		}
		in++;
		ctxt->input->col++;
		goto get_more;
	    }
	    nbchar = in - ctxt->input->cur;
	    if (nbchar > 0) {
		if ((ctxt->sax != NULL) &&
		    (ctxt->sax->ignorableWhitespace !=
		     ctxt->sax->characters) &&
		    (IS_BLANK_CH(*ctxt->input->cur))) {
		    const xmlChar *tmp = ctxt->input->cur;
		    ctxt->input->cur = in;

		    if (areBlanks(ctxt, tmp, nbchar, 0)) {
		        if (ctxt->sax->ignorableWhitespace != NULL)
			    ctxt->sax->ignorableWhitespace(ctxt->userData,
							   tmp, nbchar);
		    } else {
		        if (ctxt->sax->characters != NULL)
			    ctxt->sax->characters(ctxt->userData,
						  tmp, nbchar);
			if (*ctxt->space == -1)
			    *ctxt->space = -2;
		    }
                    line = ctxt->input->line;
                    col = ctxt->input->col;
		} else if (ctxt->sax != NULL) {
		    if (ctxt->sax->characters != NULL)
			ctxt->sax->characters(ctxt->userData,
					      ctxt->input->cur, nbchar);
                    line = ctxt->input->line;
                    col = ctxt->input->col;
		}
                /* something really bad happened in the SAX callback */
                if (ctxt->instate != XML_PARSER_CONTENT)
                    RETURN();
	    }
	    ctxt->input->cur = in;
	    if (*in == 0xD) {
		in++;
		if (*in == 0xA) {
		    ctxt->input->cur = in;
		    in++;
		    ctxt->input->line++; ctxt->input->col = 1;
		    continue; /* while */
		}
		in--;
	    }
	    if (*in == '<') {
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }
	    if (*in == '&') {
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }
	    SHRINK;
	    GROW;
            if (ctxt->instate == XML_PARSER_EOF)
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    in = ctxt->input->cur;
	} while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
	nbchar = 0;
    }
    ctxt->input->line = line;
    ctxt->input->col = col;
    xmlParseCharDataComplex(ctxt, cdata);
    /* In this complex case, the output text may be different from the parsed input string */
    RETURN_COMMENT(("parsed = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
}